

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

char * nextArgument(char *start,char **str,size_t *len)

{
  long lVar1;
  char *pcVar2;
  char *local_30;
  char *p;
  size_t *len_local;
  char **str_local;
  char *start_local;
  
  local_30 = start;
  if ((*start == '$') || (local_30 = strchr(start,0x24), local_30 != (char *)0x0)) {
    lVar1 = strtol(local_30 + 1,(char **)0x0,10);
    *len = (long)(int)lVar1;
    pcVar2 = strchr(local_30,0xd);
    if (pcVar2 == (char *)0x0) {
      __assert_fail("p",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/async.c"
                    ,0x284,"const char *nextArgument(const char *, const char **, size_t *)");
    }
    *str = pcVar2 + 2;
    start_local = pcVar2 + *len + 4;
  }
  else {
    start_local = (char *)0x0;
  }
  return start_local;
}

Assistant:

static const char *nextArgument(const char *start, const char **str, size_t *len) {
    const char *p = start;
    if (p[0] != '$') {
        p = strchr(p,'$');
        if (p == NULL) return NULL;
    }

    *len = (int)strtol(p+1,NULL,10);
    p = strchr(p,'\r');
    assert(p);
    *str = p+2;
    return p+2+(*len)+2;
}